

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseMaps.cpp
# Opt level: O2

bool __thiscall
tonk::ConnectionAddrMap::ChangeAddress
          (ConnectionAddrMap *this,UDPAddress *oldAddress,UDPAddress *newAddress,
          IConnection *connection)

{
  uint32_t uVar1;
  insert_result iVar2;
  address_v4 aVar3;
  bool bVar4;
  bool bVar5;
  Locker locker;
  undefined8 local_40;
  anon_union_16_3_a3f0114d_for___in6_u local_38;
  ulong local_28;
  
  locker.TheLock = &this->AddressMapLock;
  std::recursive_mutex::lock(&(locker.TheLock)->cs);
  if (this->RecentConnection == connection) {
    (this->RecentAddress).impl_.data_.base.sa_family = 2;
    *(undefined8 *)((long)&(this->RecentAddress).impl_.data_ + 2) = 0;
    *(undefined8 *)((long)&(this->RecentAddress).impl_.data_ + 10) = 0;
    *(undefined8 *)((long)&(this->RecentAddress).impl_.data_ + 0xc) = 0;
    *(undefined8 *)((long)&(this->RecentAddress).impl_.data_ + 0x14) = 0;
    this->RecentConnection = (IConnection *)0x0;
  }
  bVar5 = (oldAddress->impl_).data_.base.sa_family != 2;
  if (bVar5) {
    local_38._0_8_ = *(undefined8 *)((long)&(oldAddress->impl_).data_ + 8);
    local_38._8_8_ = *(undefined8 *)((long)&(oldAddress->impl_).data_ + 0x10);
    local_28 = (ulong)(oldAddress->impl_).data_.v6.sin6_scope_id;
    aVar3.addr_.s_addr = (in4_addr_type)0;
  }
  else {
    aVar3.addr_.s_addr = (in4_addr_type)(oldAddress->impl_).data_.v6.sin6_flowinfo;
    local_28 = 0;
    local_38._0_8_ = 0;
    local_38._8_8_ = 0;
  }
  local_40 = (IConnection *)CONCAT44(aVar3.addr_.s_addr,(uint)bVar5);
  bVar5 = asio::ip::address::is_unspecified((address *)&local_40);
  if (!bVar5) {
    ConnectionMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::UDPAddressHasher>::Remove
              (&this->AddressMap,oldAddress,connection);
  }
  bVar5 = (newAddress->impl_).data_.base.sa_family != 2;
  if (bVar5) {
    local_38._0_8_ = *(undefined8 *)((long)&(newAddress->impl_).data_ + 8);
    local_38._8_8_ = *(undefined8 *)((long)&(newAddress->impl_).data_ + 0x10);
    local_28 = (ulong)(newAddress->impl_).data_.v6.sin6_scope_id;
    uVar1 = 0;
  }
  else {
    uVar1 = (newAddress->impl_).data_.v6.sin6_flowinfo;
    local_28 = 0;
    local_38._0_8_ = 0;
    local_38._8_8_ = 0;
  }
  local_40 = (IConnection *)CONCAT44(uVar1,(uint)bVar5);
  bVar5 = asio::ip::address::is_unspecified((address *)&local_40);
  bVar4 = true;
  if (!bVar5) {
    local_40 = connection;
    iVar2 = LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::IConnection_*,_tonk::UDPAddressHasher>
            ::insert(&(this->AddressMap).TheMap,newAddress,(IConnection **)&local_40);
    bVar4 = (bool)(iVar2.second & 1);
  }
  Locker::~Locker(&locker);
  return bVar4;
}

Assistant:

bool ConnectionAddrMap::ChangeAddress(
    const UDPAddress& oldAddress,
    const UDPAddress& newAddress,
    IConnection* connection)
{
    Locker locker(AddressMapLock);

    // Remove from recent list
    if (RecentConnection == connection)
    {
        RecentAddress = UDPAddress();
        RecentConnection = nullptr;
    }

    if (!oldAddress.address().is_unspecified()) {
        AddressMap.Remove(oldAddress, connection);
    }
    if (!newAddress.address().is_unspecified()) {
        return AddressMap.Insert(newAddress, connection);
    }

    // If new address is unspecified, return true
    return true;
}